

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::CompactReporter::testRunEnded(CompactReporter *this,TestRunStats *_testRunStats)

{
  size_t sVar1;
  _anonymous_namespace_ *this_00;
  size_t sVar2;
  pointer pcVar3;
  ostream *poVar4;
  size_t sVar5;
  size_t count;
  size_t count_00;
  size_t count_01;
  size_t count_02;
  Colour *this_01;
  Colour colour;
  allocator<char> local_102;
  allocator<char> local_101;
  string qualify_assertions_failed;
  string local_e0;
  Colour colour_1;
  Colour colour_2;
  undefined1 local_80 [40];
  undefined1 local_58 [40];
  
  poVar4 = (this->super_StreamingReporterBase<Catch::CompactReporter>).stream;
  sVar1 = (_testRunStats->totals).testCases.failed;
  sVar5 = (_testRunStats->totals).testCases.passed + sVar1 +
          (_testRunStats->totals).testCases.failedButOk;
  if (sVar5 == 0) {
    std::operator<<(poVar4,"No tests ran.");
  }
  else {
    if (sVar1 == sVar5) {
      colour.m_moved = false;
      Colour::use(BrightRed);
      this_00 = (_anonymous_namespace_ *)(_testRunStats->totals).assertions.failed;
      if (this_00 ==
          this_00 + (_testRunStats->totals).assertions.failedButOk +
                    (_testRunStats->totals).assertions.passed) {
        ::(anonymous_namespace)::bothOrAll_abi_cxx11_(&qualify_assertions_failed,this_00,count);
      }
      else {
        qualify_assertions_failed._M_dataplus._M_p = (pointer)&qualify_assertions_failed.field_2;
        qualify_assertions_failed._M_string_length = 0;
        qualify_assertions_failed.field_2._M_local_buf[0] = '\0';
      }
      poVar4 = std::operator<<(poVar4,"Failed ");
      ::(anonymous_namespace)::bothOrAll_abi_cxx11_
                (&local_e0,(_anonymous_namespace_ *)(_testRunStats->totals).testCases.failed,
                 count_01);
      poVar4 = std::operator<<(poVar4,(string *)&local_e0);
      sVar1 = (_testRunStats->totals).testCases.failed;
      std::__cxx11::string::string<std::allocator<char>>((string *)&colour_1,"test case",&local_102)
      ;
      local_58._0_8_ = sVar1;
      std::__cxx11::string::string
                ((string *)(local_58 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&colour_1);
      Catch::operator<<(poVar4,(pluralise *)local_58);
      poVar4 = std::operator<<(poVar4,", failed ");
      poVar4 = std::operator<<(poVar4,(string *)&qualify_assertions_failed);
      pcVar3 = (pointer)(_testRunStats->totals).assertions.failed;
      std::__cxx11::string::string<std::allocator<char>>((string *)&colour_2,"assertion",&local_101)
      ;
      local_80._0_8_ = pcVar3;
      std::__cxx11::string::string
                ((string *)(local_80 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&colour_2);
      Catch::operator<<(poVar4,(pluralise *)local_80);
      std::operator<<(poVar4,'.');
      std::__cxx11::string::~string((string *)(local_80 + 8));
      std::__cxx11::string::~string((string *)&colour_2);
      std::__cxx11::string::~string((string *)(local_58 + 8));
      std::__cxx11::string::~string((string *)&colour_1);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&qualify_assertions_failed);
      this_01 = &colour;
    }
    else {
      sVar1 = (_testRunStats->totals).assertions.failed;
      if ((_testRunStats->totals).assertions.passed + sVar1 +
          (_testRunStats->totals).assertions.failedButOk == 0) {
        poVar4 = std::operator<<(poVar4,"Passed ");
        ::(anonymous_namespace)::bothOrAll_abi_cxx11_
                  ((string *)local_80,
                   (_anonymous_namespace_ *)
                   ((_testRunStats->totals).testCases.failed +
                    (_testRunStats->totals).testCases.passed +
                   (_testRunStats->totals).testCases.failedButOk),count_00);
        poVar4 = std::operator<<(poVar4,(string *)local_80);
        sVar1 = (_testRunStats->totals).testCases.passed;
        sVar5 = (_testRunStats->totals).testCases.failed;
        sVar2 = (_testRunStats->totals).testCases.failedButOk;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&qualify_assertions_failed,"test case",(allocator<char> *)&local_e0);
        local_58._0_8_ = sVar5 + sVar1 + sVar2;
        std::__cxx11::string::string((string *)(local_58 + 8),&qualify_assertions_failed);
        Catch::operator<<(poVar4,(pluralise *)local_58);
        std::operator<<(poVar4," (no assertions).");
        std::__cxx11::string::~string((string *)(local_58 + 8));
        std::__cxx11::string::~string((string *)&qualify_assertions_failed);
        std::__cxx11::string::~string((string *)local_80);
        goto LAB_00121be1;
      }
      if (sVar1 == 0) {
        colour_2.m_moved = false;
        Colour::use(BrightGreen);
        poVar4 = std::operator<<(poVar4,"Passed ");
        ::(anonymous_namespace)::bothOrAll_abi_cxx11_
                  (&qualify_assertions_failed,
                   (_anonymous_namespace_ *)(_testRunStats->totals).testCases.passed,count_02);
        poVar4 = std::operator<<(poVar4,(string *)&qualify_assertions_failed);
        sVar1 = (_testRunStats->totals).testCases.passed;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,"test case",(allocator<char> *)&colour);
        local_58._0_8_ = sVar1;
        std::__cxx11::string::string((string *)(local_58 + 8),&local_e0);
        Catch::operator<<(poVar4,(pluralise *)local_58);
        poVar4 = std::operator<<(poVar4," with ");
        pcVar3 = (pointer)(_testRunStats->totals).assertions.passed;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&colour_1,"assertion",&local_102);
        local_80._0_8_ = pcVar3;
        std::__cxx11::string::string
                  ((string *)(local_80 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&colour_1);
        Catch::operator<<(poVar4,(pluralise *)local_80);
        std::operator<<(poVar4,'.');
        std::__cxx11::string::~string((string *)(local_80 + 8));
        std::__cxx11::string::~string((string *)&colour_1);
        std::__cxx11::string::~string((string *)(local_58 + 8));
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&qualify_assertions_failed);
        this_01 = &colour_2;
      }
      else {
        colour_1.m_moved = false;
        Colour::use(BrightRed);
        poVar4 = std::operator<<(poVar4,"Failed ");
        sVar1 = (_testRunStats->totals).testCases.failed;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&qualify_assertions_failed,"test case",(allocator<char> *)&colour_2);
        local_58._0_8_ = sVar1;
        std::__cxx11::string::string((string *)(local_58 + 8),&qualify_assertions_failed);
        Catch::operator<<(poVar4,(pluralise *)local_58);
        poVar4 = std::operator<<(poVar4,", failed ");
        pcVar3 = (pointer)(_testRunStats->totals).assertions.failed;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,"assertion",(allocator<char> *)&colour);
        local_80._0_8_ = pcVar3;
        std::__cxx11::string::string((string *)(local_80 + 8),&local_e0);
        Catch::operator<<(poVar4,(pluralise *)local_80);
        std::operator<<(poVar4,'.');
        std::__cxx11::string::~string((string *)(local_80 + 8));
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)(local_58 + 8));
        std::__cxx11::string::~string((string *)&qualify_assertions_failed);
        this_01 = &colour_1;
      }
    }
    Colour::~Colour(this_01);
  }
LAB_00121be1:
  poVar4 = std::operator<<((this->super_StreamingReporterBase<Catch::CompactReporter>).stream,'\n');
  std::endl<char,std::char_traits<char>>(poVar4);
  StreamingReporterBase<Catch::CompactReporter>::testRunEnded
            (&this->super_StreamingReporterBase<Catch::CompactReporter>,_testRunStats);
  return;
}

Assistant:

void CompactReporter::testRunEnded( TestRunStats const& _testRunStats ) {
            printTotals( stream, _testRunStats.totals );
            stream << '\n' << std::endl;
            StreamingReporterBase::testRunEnded( _testRunStats );
        }